

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O2

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  ON_4fColor OVar9;
  ON_4fColor col;
  ON_4fColor colDark;
  ON_4fColor local_18;
  undefined1 auVar10 [12];
  
  ON_4fColor::ON_4fColor(&colDark,0,0,0x40,0xff);
  if (-3.0 <= altitude) {
    dVar1 = altitude;
    if (altitude <= 0.0) {
      dVar1 = 0.0;
    }
    dVar1 = pow(dVar1,1.5);
    dVar1 = dVar1 * 30.0 + 500.0;
    if (5300.0 <= dVar1) {
      dVar1 = 5300.0;
    }
    dVar2 = pow(2.718281828459045,14388.0 / (dVar1 * 0.6));
    dVar2 = 12.86008230452675 / (dVar2 + -1.0);
    dVar3 = pow(2.718281828459045,14388.0 / (dVar1 * 0.56));
    dVar1 = pow(2.718281828459045,14388.0 / (dVar1 * 0.44));
    auVar4._8_4_ = SUB84(dVar1 + -1.0,0);
    auVar4._0_8_ = dVar3 + -1.0;
    auVar4._12_4_ = (int)((ulong)(dVar1 + -1.0) >> 0x20);
    auVar4 = divpd(_DAT_006ce980,auVar4);
    uVar5 = auVar4._8_4_;
    uVar6 = auVar4._12_4_;
    if (auVar4._8_8_ <= auVar4._0_8_) {
      uVar5 = auVar4._0_4_;
      uVar6 = auVar4._4_4_;
    }
    dVar1 = (double)CONCAT44(uVar6,uVar5);
    if ((double)CONCAT44(uVar6,uVar5) <= dVar2) {
      dVar1 = dVar2;
    }
    dVar1 = 1.0 / dVar1;
    dVar2 = dVar2 * dVar1;
    auVar7._0_8_ = dVar1 * auVar4._0_8_;
    auVar7._8_8_ = dVar1 * auVar4._8_8_;
    auVar4 = divpd(auVar7,_DAT_006ce990);
    dVar3 = auVar4._0_8_;
    dVar8 = auVar4._8_8_;
    dVar1 = dVar8;
    if (dVar8 <= dVar3) {
      dVar1 = dVar3;
    }
    if (dVar1 <= dVar2) {
      dVar1 = dVar2;
    }
    dVar1 = 1.0 / dVar1;
    dVar2 = pow(dVar2 * dVar1,0.15);
    dVar3 = pow(dVar3 * dVar1,0.15);
    dVar1 = pow(dVar1 * dVar8,0.15);
    ON_4fColor::ON_4fColor(&local_18,(float)dVar2,(float)dVar3,(float)dVar1,1.0);
    col.m_color[0] = local_18.m_color[0];
    col.m_color[1] = local_18.m_color[1];
    col.m_color[2] = local_18.m_color[2];
    col.m_color[3] = local_18.m_color[3];
    if (altitude < 0.0) {
      ON_4fColor::BlendTo(&col,(float)(altitude / -3.0),&colDark,false);
    }
  }
  else {
    col.m_color[0] = colDark.m_color[0];
    col.m_color[1] = colDark.m_color[1];
    col.m_color[2] = colDark.m_color[2];
    col.m_color[3] = colDark.m_color[3];
  }
  OVar9.m_color[0] = col.m_color[0];
  auVar10._4_4_ = col.m_color[1];
  OVar9.m_color[2] = col.m_color[2];
  OVar9.m_color[3] = col.m_color[3];
  return (ON_4fColor)OVar9.m_color;
}

Assistant:

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude) // Static.
{
  ON_4fColor colDark(0, 0, 64, 255);

  if (altitude < -TwilightZone())
    return colDark;

  const double value = (30.0 * pow(std::max(0.0, altitude), 1.5)) + 500.0;
  auto temperature = std::min(5300.0, value);

  ON_4fColor col = ColorTemperature(temperature);

  if (altitude < 0.0)
  {
    const double dBlend = -altitude / TwilightZone();
    col.BlendTo(float(dBlend), colDark);
  }

  return col;
}